

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

void __thiscall JsrtDebuggerObjectsManager::ClearAll(JsrtDebuggerObjectsManager *this)

{
  int iVar1;
  DebuggerObjectsDictionary *pDVar2;
  JsrtDebuggerObjectBase *buffer;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  ulong uVar3;
  int iVar4;
  
  if (this->dataToDebuggerObjectsDictionary !=
      (BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    JsUtil::
    BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this->dataToDebuggerObjectsDictionary);
  }
  pDVar2 = this->handleToDebuggerObjectsDictionary;
  if (pDVar2 != (DebuggerObjectsDictionary *)0x0) {
    if (pDVar2->bucketCount != 0) {
      uVar3 = 0;
      do {
        iVar4 = pDVar2->buckets[uVar3];
        while (iVar4 != -1) {
          iVar1 = pDVar2->entries[iVar4].
                  super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_JsrtDebuggerObjectBase_*>.
                  super_ValueEntry<JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>.next;
          buffer = pDVar2->entries[iVar4].
                   super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_JsrtDebuggerObjectBase_*>.
                   super_ValueEntry<JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>.value;
          this_00 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          (**buffer->_vptr_JsrtDebuggerObjectBase)(buffer);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_00,buffer,0x18);
          iVar4 = iVar1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < pDVar2->bucketCount);
    }
    JsUtil::
    BaseDictionary<unsigned_int,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this->handleToDebuggerObjectsDictionary);
  }
  this->handleId = 0;
  return;
}

Assistant:

void JsrtDebuggerObjectsManager::ClearAll()
{
    if (this->dataToDebuggerObjectsDictionary != nullptr)
    {
        this->dataToDebuggerObjectsDictionary->Clear();
    }

    if (this->handleToDebuggerObjectsDictionary != nullptr)
    {
        this->handleToDebuggerObjectsDictionary->Map([this](uint handle, JsrtDebuggerObjectBase* debuggerObject) {
            Adelete(this->GetDebugObjectArena(), debuggerObject);
        });
        this->handleToDebuggerObjectsDictionary->Clear();
    }

    this->handleId = 0;
}